

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

MessageSizeCounts __thiscall capnp::_::StructReader::totalSize(StructReader *this)

{
  ushort uVar1;
  WordCount64 amount;
  int iVar2;
  long lVar3;
  MessageSizeCounts MVar4;
  
  uVar1 = this->pointerCount;
  amount = ((ulong)this->dataSize + 0x3f >> 6) + (ulong)uVar1;
  if ((ulong)uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      MVar4 = WireHelpers::totalSize
                        (this->segment,
                         (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar3),
                         this->nestingLimit);
      amount = amount + MVar4.wordCount;
      iVar2 = iVar2 + MVar4.capCount;
      lVar3 = lVar3 + 8;
    } while ((ulong)uVar1 * 8 != lVar3);
  }
  if (this->segment != (SegmentReader *)0x0) {
    ReadLimiter::unread(this->segment->readLimiter,amount);
  }
  MVar4.capCount = iVar2;
  MVar4.wordCount = amount;
  MVar4._12_4_ = 0;
  return MVar4;
}

Assistant:

MessageSizeCounts StructReader::totalSize() const {
  MessageSizeCounts result = {
    WireHelpers::roundBitsUpToWords(dataSize) + pointerCount * WORDS_PER_POINTER, 0 };

  for (auto i: kj::zeroTo(pointerCount)) {
    result += WireHelpers::totalSize(segment, pointers + i, nestingLimit);
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}